

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::FindPairing
          (UnorderedElementsAreMatcherImplBase *this,MatchMatrix *matrix,
          MatchResultListener *listener)

{
  MatchResultListener *pMVar1;
  bool bVar2;
  ulong uVar3;
  ElementMatcherPairs matches;
  char *sep;
  ElementMatcherPairs local_50;
  char *local_38;
  
  FindMaxBipartiteMatching(&local_50,matrix);
  uVar3 = (long)local_50.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (((*(uint *)this & 1) == 0) || (*(ulong *)(matrix + 8) <= uVar3)) {
    if (((*(uint *)this & 2) == 0) || (*(ulong *)matrix <= uVar3)) {
      bVar2 = true;
      if (((1 < uVar3) && (listener->stream_ != (ostream *)0x0)) &&
         (local_38 = "where:\n",
         local_50.
         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         local_50.
         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start)) {
        uVar3 = 0;
        do {
          pMVar1 = MatchResultListener::operator<<(listener,&local_38);
          pMVar1 = MatchResultListener::operator<<(pMVar1,(char (*) [13])" - element #");
          if (pMVar1->stream_ != (ostream *)0x0) {
            std::ostream::_M_insert<unsigned_long>((ulong)pMVar1->stream_);
          }
          pMVar1 = MatchResultListener::operator<<(pMVar1,(char (*) [25])" is matched by matcher #")
          ;
          if (pMVar1->stream_ != (ostream *)0x0) {
            std::ostream::_M_insert<unsigned_long>((ulong)pMVar1->stream_);
          }
          local_38 = ",\n";
          uVar3 = uVar3 + 1;
        } while (uVar3 < (ulong)((long)local_50.
                                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_50.
                                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      goto LAB_001554eb;
    }
    if (listener->stream_ != (ostream *)0x0) {
      pMVar1 = MatchResultListener::operator<<
                         (listener,(char (*) [65])
                                   "where not all elements can be matched, and the closest match is "
                         );
      if (pMVar1->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar1->stream_);
      }
      pMVar1 = MatchResultListener::operator<<(pMVar1,(char (*) [5])0x171185);
      if (pMVar1->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar1->stream_);
      }
      MatchResultListener::operator<<(pMVar1,(char (*) [30])" matchers with the pairings:\n");
      goto LAB_0015541a;
    }
  }
  else if (listener->stream_ != (ostream *)0x0) {
    pMVar1 = MatchResultListener::operator<<
                       (listener,(char (*) [89])
                                 "where no permutation of the elements can satisfy all matchers, and the closest match is "
                       );
    if (pMVar1->stream_ != (ostream *)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)pMVar1->stream_);
    }
    pMVar1 = MatchResultListener::operator<<(pMVar1,(char (*) [5])0x171185);
    if (pMVar1->stream_ != (ostream *)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)pMVar1->stream_);
    }
    MatchResultListener::operator<<(pMVar1,(char (*) [30])" matchers with the pairings:\n");
LAB_0015541a:
    LogElementMatcherPairVec(&local_50,listener->stream_);
  }
  bVar2 = false;
LAB_001554eb:
  if (local_50.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::FindPairing(
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  ElementMatcherPairs matches = FindMaxBipartiteMatching(matrix);

  size_t max_flow = matches.size();
  if ((match_flags() & UnorderedMatcherRequire::Superset) &&
      max_flow < matrix.RhsSize()) {
    if (listener->IsInterested()) {
      *listener << "where no permutation of the elements can satisfy all "
                   "matchers, and the closest match is "
                << max_flow << " of " << matrix.RhsSize()
                << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }
  if ((match_flags() & UnorderedMatcherRequire::Subset) &&
      max_flow < matrix.LhsSize()) {
    if (listener->IsInterested()) {
      *listener
          << "where not all elements can be matched, and the closest match is "
          << max_flow << " of " << matrix.RhsSize()
          << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }

  if (matches.size() > 1) {
    if (listener->IsInterested()) {
      const char* sep = "where:\n";
      for (size_t mi = 0; mi < matches.size(); ++mi) {
        *listener << sep << " - element #" << matches[mi].first
                  << " is matched by matcher #" << matches[mi].second;
        sep = ",\n";
      }
    }
  }
  return true;
}